

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

int read_dns_answers(answer *answers,char *message)

{
  int iVar1;
  ulong in_RAX;
  int i;
  uint uVar2;
  ulong uVar3;
  char *src;
  bool bVar4;
  undefined8 uStack_38;
  
  src = message + 0xc;
  for (uVar2 = 0; uVar2 != (ushort)(*(ushort *)(message + 4) << 8 | *(ushort *)(message + 4) >> 8);
      uVar2 = uVar2 + 1) {
    for (; (long)*src != 0; src = src + (long)*src + 1) {
    }
    src = src + 5;
  }
  uVar2 = (uint)(ushort)(*(ushort *)(message + 6) << 8 | *(ushort *)(message + 6) >> 8);
  uVar3 = 0;
  uStack_38 = in_RAX;
  while( true ) {
    bVar4 = uVar2 == 0;
    uVar2 = uVar2 - 1;
    if (bVar4) break;
    uStack_38 = uStack_38 & 0xffffffffffffff;
    iVar1 = read_dns_answer(answers + uVar3,src,message,(_Bool *)((long)&uStack_38 + 7));
    src = src + iVar1;
    uVar3 = (ulong)((int)uVar3 + (uint)uStack_38._7_1_);
  }
  return (int)uVar3;
}

Assistant:

int read_dns_answers(struct answer *answers, char *message) {
  //读取报文中所有回答
  struct dns_header *header;
  struct answer_struct *answer_struct;
  header = (struct dns_header *)message;
  unsigned short ans = ntohs(header->ancount);
  unsigned short question = ntohs(header->qdcount);
  char *data = message + DNS_HEADER_SIZE;
      // printf("");fflush(stdout);

  for (int i = 0; i < question; i++) {
    while ((*data) != 0)
      data += (*data) + 1;
    data += 5;
  }
  bool good = false;
  int cnt = 0;
  for (int i = 0; i < ans && data != 0; i++) {
    good = false;
    data +=  read_dns_answer((struct answer *)&answers[cnt], data, message,&good);
    if(good){
      cnt++;
    }
  }
  
  return cnt;
}